

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSModuleDef * js_host_resolve_imported_module(JSContext *ctx,char *base_cname,char *cname1)

{
  char cVar1;
  JSRuntime *pJVar2;
  JSAtom v;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  list_head *plVar9;
  undefined1 auVar10 [16];
  JSValue JVar11;
  
  pJVar2 = ctx->rt;
  if (pJVar2->module_normalize_func == (JSModuleNormalizeFunc *)0x0) {
    if (*cname1 == '.') {
      pcVar3 = strrchr(base_cname,0x2f);
      sVar7 = (size_t)((int)pcVar3 - (int)base_cname);
      if (pcVar3 == (char *)0x0) {
        sVar7 = 0;
      }
      sVar4 = strlen(cname1);
      pcVar3 = (char *)js_malloc(ctx,sVar4 + sVar7 + 2);
      if (pcVar3 == (char *)0x0) {
        return (JSModuleDef *)0x0;
      }
      memcpy(pcVar3,base_cname,sVar7);
      pcVar3[sVar7] = '\0';
      cVar1 = *cname1;
      while (cVar1 == '.') {
        lVar5 = 2;
        if (cname1[1] != '/') {
          if ((cname1[1] != '.') || (cname1[2] != '/')) break;
          if (*pcVar3 == '\0') goto LAB_0012a216;
          pcVar6 = strrchr(pcVar3,0x2f);
          pcVar8 = pcVar6 + 1;
          if (pcVar6 == (char *)0x0) {
            pcVar8 = pcVar3;
          }
          if (*pcVar8 == '.') {
            cVar1 = pcVar8[1];
            if (cVar1 == '.') {
              cVar1 = pcVar8[2];
            }
            if (cVar1 == '\0') break;
          }
          pcVar8[-(ulong)(pcVar3 < pcVar8)] = '\0';
          lVar5 = 3;
        }
        cVar1 = cname1[lVar5];
        cname1 = cname1 + lVar5;
      }
      if (*pcVar3 != '\0') {
        sVar7 = strlen(pcVar3);
        (pcVar3 + sVar7)[0] = '/';
        (pcVar3 + sVar7)[1] = '\0';
      }
LAB_0012a216:
      strcat(pcVar3,cname1);
      goto LAB_0012a129;
    }
    pcVar3 = js_strdup(ctx,cname1);
  }
  else {
    pcVar3 = (*pJVar2->module_normalize_func)(ctx,base_cname,cname1,pJVar2->module_loader_opaque);
  }
  if (pcVar3 == (char *)0x0) {
    return (JSModuleDef *)0x0;
  }
LAB_0012a129:
  sVar7 = strlen(pcVar3);
  v = JS_NewAtomLen(ctx,pcVar3,sVar7);
  if (v == 0) {
    (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
    return (JSModuleDef *)0x0;
  }
  plVar9 = (ctx->loaded_modules).next;
  while( true ) {
    if (plVar9 == &ctx->loaded_modules) {
      JS_FreeAtom(ctx,v);
      if (pJVar2->module_loader_func == (JSModuleLoaderFunc *)0x0) {
        JVar11 = JS_ThrowReferenceError(ctx,"could not load module \'%s\'",pcVar3);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = JVar11.tag;
        auVar10 = auVar10 << 0x40;
      }
      else {
        auVar10 = (undefined1  [16])
                  (*pJVar2->module_loader_func)(ctx,pcVar3,pJVar2->module_loader_opaque);
      }
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
      return auVar10._0_8_;
    }
    if (*(JSAtom *)((long)&plVar9[-1].next + 4) == v) break;
    plVar9 = plVar9->next;
  }
  (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,pcVar3);
  JS_FreeAtom(ctx,v);
  return (JSModuleDef *)&plVar9[-1].next;
}

Assistant:

static JSModuleDef *js_host_resolve_imported_module(JSContext *ctx,
                                                    const char *base_cname,
                                                    const char *cname1)
{
    JSRuntime *rt = ctx->rt;
    JSModuleDef *m;
    char *cname;
    JSAtom module_name;

    if (!rt->module_normalize_func) {
        cname = js_default_module_normalize_name(ctx, base_cname, cname1);
    } else {
        cname = rt->module_normalize_func(ctx, base_cname, cname1,
                                          rt->module_loader_opaque);
    }
    if (!cname)
        return NULL;

    module_name = JS_NewAtom(ctx, cname);
    if (module_name == JS_ATOM_NULL) {
        js_free(ctx, cname);
        return NULL;
    }

    /* first look at the loaded modules */
    m = js_find_loaded_module(ctx, module_name);
    if (m) {
        js_free(ctx, cname);
        JS_FreeAtom(ctx, module_name);
        return m;
    }

    JS_FreeAtom(ctx, module_name);

    /* load the module */
    if (!rt->module_loader_func) {
        /* XXX: use a syntax error ? */
        JS_ThrowReferenceError(ctx, "could not load module '%s'",
                               cname);
        js_free(ctx, cname);
        return NULL;
    }

    m = rt->module_loader_func(ctx, cname, rt->module_loader_opaque);
    js_free(ctx, cname);
    return m;
}